

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registered_type.cpp
# Opt level: O1

char * __thiscall Am_Registered_Type::To_String(Am_Registered_Type *this)

{
  return (char *)0x0;
}

Assistant:

const char *
Am_Registered_Type::To_String() const
{
#ifdef DEBUG
  const char *name = Am_Get_Name_Of_Item(this);
  return (name);
#else
  return (0L);
#endif
}